

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assigner.hpp
# Opt level: O1

void __thiscall
diy::DynamicAssigner::DynamicAssigner
          (DynamicAssigner *this,communicator *comm,int size__,int nblocks__)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  DIY_MPI_Win win;
  DIY_MPI_Win local_20;
  
  (this->super_Assigner).size_ = size__;
  (this->super_Assigner).nblocks_ = nblocks__;
  (this->super_Assigner)._vptr_Assigner = (_func_int **)&PTR__DynamicAssigner_001c27d8;
  (this->comm_).comm_.data = (comm->comm_).data;
  uVar1 = comm->rank_;
  uVar2 = comm->size_;
  (this->comm_).rank_ = uVar1;
  (this->comm_).size_ = uVar2;
  (this->comm_).owner_ = false;
  iVar3 = (nblocks__ / size__ + 1) - (uint)(nblocks__ % size__ == 0);
  this->div_ = iVar3;
  (this->rank_map_).buffer_ = (void *)0x0;
  (this->rank_map_).rank_ = uVar1;
  MPI_Win_allocate(iVar3 * 4,4,&ompi_mpi_info_null,(this->comm_).comm_.data,&this->rank_map_,
                   &local_20);
  (this->rank_map_).window_.data = local_20.data;
  MPI_Win_lock_all(1);
  return;
}

Assistant:

DynamicAssigner(const mpi::communicator& comm, int size__, int nblocks__):
                      Assigner(size__, nblocks__),
                      comm_(comm),
                      div_(nblocks__ / size__ + ((nblocks__ % size__) == 0 ? 0 : 1)),   // NB: same size window everywhere means the last rank may allocate extra space
                      rank_map_(comm_, div_)                                            { rank_map_.lock_all(mpi::nocheck); }